

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_wsi_mux_mark_parents_needing_writeable(lws *wsi)

{
  lws_log_cx *cx;
  lws *local_18;
  lws *wsi2;
  lws *wsi_local;
  
  for (local_18 = wsi; local_18 != (lws *)0x0; local_18 = (local_18->mux).parent_wsi) {
    (local_18->mux).requested_POLLOUT = '\x01';
    cx = lwsl_wsi_get_cx(local_18);
    _lws_log_cx(cx,lws_log_prepend_wsi,local_18,8,"lws_wsi_mux_mark_parents_needing_writeable",
                "sid %u, pending writable",(local_18->mux).my_sid);
  }
  return 0;
}

Assistant:

int
lws_wsi_mux_mark_parents_needing_writeable(struct lws *wsi)
{
	struct lws /* *network_wsi = lws_get_network_wsi(wsi), */ *wsi2;
	//int already = network_wsi->mux.requested_POLLOUT;

	/* mark everybody above him as requesting pollout */

	wsi2 = wsi;
	while (wsi2) {
		wsi2->mux.requested_POLLOUT = 1;
		lwsl_wsi_info(wsi2, "sid %u, pending writable",
							wsi2->mux.my_sid);
		wsi2 = wsi2->mux.parent_wsi;
	}

	return 0; // already;
}